

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O2

string * __thiscall
ExactFloat::ToStringWithMaxDigits_abi_cxx11_
          (string *__return_storage_ptr__,ExactFloat *this,int max_digits)

{
  uint uVar1;
  char *pcVar2;
  int i;
  int iVar3;
  char *pcVar4;
  char cVar5;
  ulong uVar6;
  string digits;
  char exp_buf [20];
  
  if (max_digits < 1) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&digits,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
               ,0x172,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)digits._M_string_length,"Check failed: (max_digits) > (0) ");
    abort();
  }
  iVar3 = this->bn_exp_;
  if (iVar3 < 0x7ffffffd) {
    digits._M_dataplus._M_p = (pointer)&digits.field_2;
    digits._M_string_length = 0;
    digits.field_2._M_local_buf[0] = '\0';
    uVar1 = GetDecimalDigits(this,max_digits,&digits);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cVar5 = (char)__return_storage_ptr__;
    if (this->sign_ < 0) {
      std::__cxx11::string::push_back(cVar5);
    }
    if ((int)uVar1 < -3 || max_digits < (int)uVar1) {
      std::__cxx11::string::push_back(cVar5);
      if (1 < digits._M_string_length) {
        std::__cxx11::string::push_back(cVar5);
        std::__cxx11::string::append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  ((string *)__return_storage_ptr__,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(digits._M_dataplus._M_p + 1),
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(digits._M_dataplus._M_p + digits._M_string_length));
      }
      sprintf(exp_buf,"e%+02d",(ulong)(uVar1 - 1));
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else if ((int)uVar1 < 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      for (; uVar1 != 0; uVar1 = uVar1 + 1) {
        std::__cxx11::string::push_back(cVar5);
      }
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      uVar6 = (ulong)uVar1;
      if (uVar6 < digits._M_string_length) {
        std::__cxx11::string::append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  ((string *)__return_storage_ptr__,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )digits._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(digits._M_dataplus._M_p + uVar6));
        std::__cxx11::string::push_back(cVar5);
        std::__cxx11::string::append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  ((string *)__return_storage_ptr__,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(digits._M_dataplus._M_p + uVar6),
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(digits._M_dataplus._M_p + digits._M_string_length));
      }
      else {
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        for (iVar3 = uVar1 - (int)digits._M_string_length; 0 < iVar3; iVar3 = iVar3 + -1) {
          std::__cxx11::string::push_back(cVar5);
        }
      }
    }
    std::__cxx11::string::~string((string *)&digits);
    return __return_storage_ptr__;
  }
  if (iVar3 == 0x7ffffffd) {
    iVar3 = this->sign_;
    pcVar2 = "-0";
    pcVar4 = "0";
  }
  else {
    if (iVar3 == 0x7fffffff) {
      pcVar4 = "nan";
      goto LAB_0026add0;
    }
    iVar3 = this->sign_;
    pcVar2 = "-inf";
    pcVar4 = "inf";
  }
  if (iVar3 < 0) {
    pcVar4 = pcVar2;
  }
LAB_0026add0:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,(allocator *)&digits);
  return __return_storage_ptr__;
}

Assistant:

string ExactFloat::ToStringWithMaxDigits(int max_digits) const {
  S2_DCHECK_GT(max_digits, 0);
  if (!is_normal()) {
    if (is_nan()) return "nan";
    if (is_zero()) return (sign_ < 0) ? "-0" : "0";
    return (sign_ < 0) ? "-inf" : "inf";
  }
  string digits;
  int exp10 = GetDecimalDigits(max_digits, &digits);
  string str;
  if (sign_ < 0) str.push_back('-');

  // We use the standard '%g' formatting rules.  If the exponent is less than
  // -4 or greater than or equal to the requested precision (i.e., max_digits)
  // then we use exponential notation.
  //
  // But since "exp10" is the base-10 exponent corresponding to a mantissa in
  // the range [0.1, 1), whereas the '%g' rules assume a mantissa in the range
  // [1.0, 10), we need to adjust these parameters by 1.
  if (exp10 <= -4 || exp10 > max_digits) {
    // Use exponential format.
    str.push_back(digits[0]);
    if (digits.size() > 1) {
      str.push_back('.');
      str.append(digits.begin() + 1, digits.end());
    }
    char exp_buf[20];
    sprintf(exp_buf, "e%+02d", exp10 - 1);
    str += exp_buf;
  } else {
    // Use fixed format.  We split this into two cases depending on whether
    // the integer portion is non-zero or not.
    if (exp10 > 0) {
      if (exp10 >= digits.size()) {
        str += digits;
        for (int i = exp10 - digits.size(); i > 0; --i) {
          str.push_back('0');
        }
      } else {
        str.append(digits.begin(), digits.begin() + exp10);
        str.push_back('.');
        str.append(digits.begin() + exp10, digits.end());
      }
    } else {
      str += "0.";
      for (int i = exp10; i < 0; ++i) {
        str.push_back('0');
      }
      str += digits;
    }
  }
  return str;
}